

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu_Impl.cpp
# Opt level: O0

blip_time_t __thiscall Vgm_Emu_Impl::run_commands(Vgm_Emu_Impl *this,vgm_time_t end_time)

{
  byte bVar1;
  ushort uVar2;
  blargg_ulong bVar3;
  uint command;
  int iVar4;
  blip_time_t bVar5;
  ushort *puVar6;
  ushort *__n;
  int in_ESI;
  Vgm_Emu_Impl *in_RDI;
  bool bVar7;
  int cmd;
  long size;
  int type;
  byte_ *pos;
  vgm_time_t vgm_time;
  int in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  uint in_stack_ffffffffffffff94;
  Ym_Emu<Ym2413_Emu> *in_stack_ffffffffffffff98;
  vgm_time_t vgm_time_00;
  Vgm_Emu_Impl *in_stack_ffffffffffffffa0;
  Ym_Emu<Ym2413_Emu> *in_stack_ffffffffffffffa8;
  Sms_Apu *in_stack_ffffffffffffffb0;
  ushort *local_18;
  int local_10;
  
  local_10 = in_RDI->vgm_time;
  local_18 = (ushort *)in_RDI->pos;
  if ((in_RDI->data_end <= local_18) &&
     (Music_Emu::set_track_ended((Music_Emu *)in_RDI), in_RDI->data_end < local_18)) {
    Gme_File::set_warning((Gme_File *)in_RDI,"Stream lacked end event");
  }
  while( true ) {
    bVar7 = false;
    if (local_10 < in_ESI) {
      bVar7 = local_18 < in_RDI->data_end;
    }
    if (!bVar7) break;
    puVar6 = (ushort *)((long)local_18 + 1);
    bVar1 = (byte)*local_18;
    if (bVar1 == 0x4f) {
      to_blip_time(in_RDI,local_10);
      Sms_Apu::write_ggstereo
                (in_stack_ffffffffffffffb0,(blip_time_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                 (int)in_stack_ffffffffffffffa8);
      local_18 = local_18 + 1;
    }
    else if (bVar1 == 0x50) {
      in_stack_ffffffffffffffb0 = &in_RDI->psg;
      to_blip_time(in_RDI,local_10);
      Sms_Apu::write_data(in_stack_ffffffffffffffb0,
                          (blip_time_t)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                          (int)in_stack_ffffffffffffffa8);
      local_18 = local_18 + 1;
    }
    else if (bVar1 == 0x51) {
      in_stack_ffffffffffffffa8 = &in_RDI->ym2413;
      __n = puVar6;
      to_fm_time(in_RDI,local_10);
      iVar4 = Ym_Emu<Ym2413_Emu>::run_until(in_stack_ffffffffffffff98,in_stack_ffffffffffffff94);
      if (iVar4 != 0) {
        Ym2413_Emu::write(&(in_RDI->ym2413).super_Ym2413_Emu,(uint)*(byte *)puVar6,
                          (void *)(ulong)(byte)local_18[1],(size_t)__n);
      }
      local_18 = (ushort *)((long)local_18 + 3);
    }
    else {
      vgm_time_00 = (vgm_time_t)((ulong)in_stack_ffffffffffffff98 >> 0x20);
      if (bVar1 == 0x52) {
        if (*(byte *)puVar6 == 0x2a) {
          write_pcm(in_stack_ffffffffffffffa0,vgm_time_00,(int)in_stack_ffffffffffffff98);
        }
        else {
          in_stack_ffffffffffffffa0 = (Vgm_Emu_Impl *)&in_RDI->ym2612;
          to_fm_time(in_RDI,local_10);
          iVar4 = Ym_Emu<Ym2612_Emu>::run_until
                            ((Ym_Emu<Ym2612_Emu> *)in_stack_ffffffffffffff98,
                             in_stack_ffffffffffffff94);
          if (iVar4 != 0) {
            if (*(byte *)puVar6 == 0x2b) {
              in_RDI->dac_disabled = ((int)(uint)(byte)local_18[1] >> 7) + -1;
              in_RDI->dac_amp = in_RDI->dac_disabled | in_RDI->dac_amp;
            }
            Ym2612_Emu::write0((Ym2612_Emu *)
                               CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                               in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
          }
        }
        local_18 = (ushort *)((long)local_18 + 3);
      }
      else if (bVar1 == 0x53) {
        in_stack_ffffffffffffff98 = (Ym_Emu<Ym2413_Emu> *)&in_RDI->ym2612;
        to_fm_time(in_RDI,local_10);
        iVar4 = Ym_Emu<Ym2612_Emu>::run_until
                          ((Ym_Emu<Ym2612_Emu> *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94
                          );
        if (iVar4 != 0) {
          Ym2612_Emu::write1((Ym2612_Emu *)
                             CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
                             in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88);
        }
        local_18 = (ushort *)((long)local_18 + 3);
      }
      else if (bVar1 == 0x61) {
        local_10 = local_10 + (uint)*puVar6;
        local_18 = (ushort *)((long)local_18 + 3);
      }
      else if (bVar1 == 0x62) {
        local_10 = local_10 + 0x2df;
        local_18 = puVar6;
      }
      else if (bVar1 == 99) {
        local_10 = local_10 + 0x372;
        local_18 = puVar6;
      }
      else if (bVar1 == 100) {
        local_10 = (uint)*(byte *)puVar6 + local_10;
        local_18 = local_18 + 1;
      }
      else if (bVar1 == 0x66) {
        local_18 = (ushort *)in_RDI->loop_begin;
      }
      else if (bVar1 == 0x67) {
        uVar2 = local_18[1];
        bVar3 = get_le32((byte *)((long)local_18 + 3));
        if ((byte)uVar2 == 0) {
          in_RDI->pcm_data = (byte *)((long)local_18 + 7);
        }
        local_18 = (ushort *)((byte *)((long)local_18 + 7) + bVar3);
      }
      else if (bVar1 == 0xe0) {
        in_RDI->pcm_pos =
             in_RDI->pcm_data +
             (long)(int)(uint)*(byte *)puVar6 +
             (ulong)(byte)local_18[1] * 0x100 +
             (ulong)*(byte *)((long)local_18 + 3) * 0x10000 + (ulong)(byte)local_18[2] * 0x1000000;
        local_18 = (ushort *)((long)local_18 + 5);
      }
      else {
        command = (uint)(byte)*local_18;
        in_stack_ffffffffffffff94 = command & 0xf0;
        if (in_stack_ffffffffffffff94 == 0x50) {
          local_18 = (ushort *)((long)local_18 + 3);
        }
        else if (in_stack_ffffffffffffff94 == 0x70) {
          local_10 = (command & 0xf) + 1 + local_10;
          local_18 = puVar6;
        }
        else if (in_stack_ffffffffffffff94 == 0x80) {
          in_RDI->pcm_pos = in_RDI->pcm_pos + 1;
          write_pcm(in_stack_ffffffffffffffa0,vgm_time_00,(int)in_stack_ffffffffffffff98);
          local_10 = (command & 0xf) + local_10;
          local_18 = puVar6;
        }
        else {
          iVar4 = command_len(command);
          Gme_File::set_warning((Gme_File *)in_RDI,"Unknown stream event");
          local_18 = (ushort *)((long)puVar6 + (long)(iVar4 + -1));
        }
      }
    }
  }
  in_RDI->pos = (byte *)local_18;
  in_RDI->vgm_time = local_10 - in_ESI;
  bVar5 = to_blip_time(in_RDI,in_ESI);
  return bVar5;
}

Assistant:

blip_time_t Vgm_Emu_Impl::run_commands( vgm_time_t end_time )
{
	vgm_time_t vgm_time = this->vgm_time; 
	byte const* pos = this->pos;
	if ( pos >= data_end )
	{
		set_track_ended();
		if ( pos > data_end )
			set_warning( "Stream lacked end event" );
	}
	
	while ( vgm_time < end_time && pos < data_end )
	{
		// TODO: be sure there are enough bytes left in stream for particular command
		// so we don't read past end
		switch ( *pos++ )
		{
		case cmd_end:
			pos = loop_begin; // if not looped, loop_begin == data_end
			break;
		
		case cmd_delay_735:
			vgm_time += 735;
			break;
		
		case cmd_delay_882:
			vgm_time += 882;
			break;
		
		case cmd_gg_stereo:
			psg.write_ggstereo( to_blip_time( vgm_time ), *pos++ );
			break;
		
		case cmd_psg:
			psg.write_data( to_blip_time( vgm_time ), *pos++ );
			break;
		
		case cmd_delay:
			vgm_time += pos [1] * 0x100L + pos [0];
			pos += 2;
			break;
		
		case cmd_byte_delay:
			vgm_time += *pos++;
			break;
		
		case cmd_ym2413:
			if ( ym2413.run_until( to_fm_time( vgm_time ) ) )
				ym2413.write( pos [0], pos [1] );
			pos += 2;
			break;
		
		case cmd_ym2612_port0:
			if ( pos [0] == ym2612_dac_port )
			{
				write_pcm( vgm_time, pos [1] );
			}
			else if ( ym2612.run_until( to_fm_time( vgm_time ) ) )
			{
				if ( pos [0] == 0x2B )
				{
					dac_disabled = (pos [1] >> 7 & 1) - 1;
					dac_amp |= dac_disabled;
				}
				ym2612.write0( pos [0], pos [1] );
			}
			pos += 2;
			break;
		
		case cmd_ym2612_port1:
			if ( ym2612.run_until( to_fm_time( vgm_time ) ) )
				ym2612.write1( pos [0], pos [1] );
			pos += 2;
			break;
			
		case cmd_data_block: {
			check( *pos == cmd_end );
			int type = pos [1];
			long size = get_le32( pos + 2 );
			pos += 6;
			if ( type == pcm_block_type )
				pcm_data = pos;
			pos += size;
			break;
		}
		
		case cmd_pcm_seek:
			pcm_pos = pcm_data + pos [3] * 0x1000000L + pos [2] * 0x10000L +
					pos [1] * 0x100L + pos [0];
			pos += 4;
			break;
		
		default:
			int cmd = pos [-1];
			switch ( cmd & 0xF0 )
			{
				case cmd_pcm_delay:
					write_pcm( vgm_time, *pcm_pos++ );
					vgm_time += cmd & 0x0F;
					break;
				
				case cmd_short_delay:
					vgm_time += (cmd & 0x0F) + 1;
					break;
				
				case 0x50:
					pos += 2;
					break;
				
				default:
					pos += command_len( cmd ) - 1;
					set_warning( "Unknown stream event" );
			}
		}
	}
	vgm_time -= end_time;
	this->pos = pos;
	this->vgm_time = vgm_time;
	
	return to_blip_time( end_time );
}